

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbb.cc
# Opt level: O0

int cbb_buffer_reserve(cbb_buffer_st *base,uint8_t **out,size_t len)

{
  uint8_t *puVar1;
  uint8_t *newbuf;
  size_t newcap;
  size_t newlen;
  size_t len_local;
  uint8_t **out_local;
  cbb_buffer_st *base_local;
  
  if (base == (cbb_buffer_st *)0x0) {
    return 0;
  }
  puVar1 = (uint8_t *)(base->len + len);
  if (puVar1 < (uint8_t *)base->len) {
    ERR_put_error(0xe,0,0x45,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/cbb.cc"
                  ,0x4f);
  }
  else {
    if (puVar1 <= (uint8_t *)base->cap) {
LAB_00624f11:
      if (out != (uint8_t **)0x0) {
        *out = base->buf + base->len;
      }
      return 1;
    }
    if ((base->field_0x18 & 1) == 0) {
      ERR_put_error(0xe,0,0x45,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/cbb.cc"
                    ,0x55);
    }
    else {
      newbuf = (uint8_t *)(base->cap << 1);
      if ((newbuf < (uint8_t *)base->cap) || (newbuf < puVar1)) {
        newbuf = puVar1;
      }
      puVar1 = (uint8_t *)OPENSSL_realloc(base->buf,(size_t)newbuf);
      if (puVar1 != (uint8_t *)0x0) {
        base->buf = puVar1;
        base->cap = (size_t)newbuf;
        goto LAB_00624f11;
      }
    }
  }
  base->field_0x18 = base->field_0x18 & 0xfd | 2;
  return 0;
}

Assistant:

static int cbb_buffer_reserve(struct cbb_buffer_st *base, uint8_t **out,
                              size_t len) {
  if (base == NULL) {
    return 0;
  }

  size_t newlen = base->len + len;
  if (newlen < base->len) {
    // Overflow
    OPENSSL_PUT_ERROR(CRYPTO, ERR_R_OVERFLOW);
    goto err;
  }

  if (newlen > base->cap) {
    if (!base->can_resize) {
      OPENSSL_PUT_ERROR(CRYPTO, ERR_R_OVERFLOW);
      goto err;
    }

    size_t newcap = base->cap * 2;
    if (newcap < base->cap || newcap < newlen) {
      newcap = newlen;
    }
    uint8_t *newbuf =
        reinterpret_cast<uint8_t *>(OPENSSL_realloc(base->buf, newcap));
    if (newbuf == NULL) {
      goto err;
    }

    base->buf = newbuf;
    base->cap = newcap;
  }

  if (out) {
    *out = base->buf + base->len;
  }

  return 1;

err:
  base->error = 1;
  return 0;
}